

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::CompareOperator<float>::doApply
          (Interval *__return_storage_ptr__,CompareOperator<float> *this,EvalContext *param_1,
          IArgs *iargs)

{
  Interval *pIVar1;
  Interval *pIVar2;
  char cVar3;
  uint uVar4;
  double local_38;
  
  pIVar1 = iargs->a;
  pIVar2 = iargs->b;
  __return_storage_ptr__->m_hasNaN = false;
  *(undefined4 *)&__return_storage_ptr__->m_lo = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_lo + 4) = 0x7ff00000;
  *(undefined4 *)&__return_storage_ptr__->m_hi = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_hi + 4) = 0xfff00000;
  cVar3 = (**(code **)(*(long *)this + 0x60))(this,pIVar1,pIVar2);
  if (cVar3 == '\0') {
    uVar4 = 0xfff00000;
  }
  else {
    __return_storage_ptr__->m_hasNaN = false;
    __return_storage_ptr__->m_lo = 1.0;
    __return_storage_ptr__->m_hi = 1.0;
    uVar4 = 0x3ff00000;
  }
  local_38 = (double)((ulong)uVar4 << 0x20);
  cVar3 = (**(code **)(*(long *)this + 0x68))(this,pIVar1,pIVar2);
  if (cVar3 != '\0') {
    __return_storage_ptr__->m_hasNaN = false;
    __return_storage_ptr__->m_lo = 0.0;
    __return_storage_ptr__->m_hi = (double)(-(ulong)(0.0 <= local_38) & (ulong)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval		doApply	(const EvalContext&, const IArgs& iargs) const
	{
		const IArg0&	arg0 = iargs.a;
		const IArg1&	arg1 = iargs.b;
		IRet	ret;

		if (canSucceed(arg0, arg1))
			ret |= true;
		if (canFail(arg0, arg1))
			ret |= false;

		return ret;
	}